

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

double __thiscall despot::POMDPX::Reward(POMDPX *this,State *state,ACT_TYPE a)

{
  int iVar1;
  reference this_00;
  reference pvVar2;
  int s;
  ACT_TYPE a_local;
  State *state_local;
  POMDPX *this_local;
  
  if ((this->is_small_ & 1U) != 0) {
    iVar1 = (*(this->super_MDP)._vptr_MDP[9])(this,state);
    this_00 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[](&this->rewards_,(long)iVar1);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)a);
    return *pvVar2;
  }
  __assert_fail("is_small_",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                ,0x18c,"virtual double despot::POMDPX::Reward(const State &, ACT_TYPE) const");
}

Assistant:

double POMDPX::Reward(const State& state, ACT_TYPE a) const {
	assert(is_small_);
	int s =GetIndex(&state);
	return rewards_[s][a];
}